

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverb.cpp
# Opt level: O1

void anon_unknown.dwarf_1957ff::StdReverb_getParamf(EffectProps *props,ALenum param,float *val)

{
  effect_exception *this;
  
  switch(param) {
  case 1:
    break;
  case 2:
    props = (EffectProps *)&(props->Reverb).Diffusion;
    break;
  case 3:
    props = (EffectProps *)&(props->Reverb).Gain;
    break;
  case 4:
    props = (EffectProps *)&(props->Reverb).GainHF;
    break;
  case 5:
    props = (EffectProps *)&(props->Reverb).DecayTime;
    break;
  case 6:
    props = (EffectProps *)&(props->Reverb).DecayHFRatio;
    break;
  case 7:
    props = (EffectProps *)&(props->Reverb).ReflectionsGain;
    break;
  case 8:
    props = (EffectProps *)&(props->Reverb).ReflectionsDelay;
    break;
  case 9:
    props = (EffectProps *)&(props->Reverb).LateReverbGain;
    break;
  case 10:
    props = (EffectProps *)&(props->Reverb).LateReverbDelay;
    break;
  case 0xb:
    props = (EffectProps *)&(props->Reverb).AirAbsorptionGainHF;
    break;
  case 0xc:
    props = (EffectProps *)&(props->Reverb).RoomRolloffFactor;
    break;
  default:
    this = (effect_exception *)__cxa_allocate_exception(0x30);
    effect_exception::effect_exception
              (this,0xa002,"Invalid reverb float property 0x%04x",(ulong)(uint)param);
    __cxa_throw(this,&effect_exception::typeinfo,al::base_exception::~base_exception);
  }
  *val = (props->Reverb).Density;
  return;
}

Assistant:

void StdReverb_getParamf(const EffectProps *props, ALenum param, float *val)
{
    switch(param)
    {
    case AL_REVERB_DENSITY:
        *val = props->Reverb.Density;
        break;

    case AL_REVERB_DIFFUSION:
        *val = props->Reverb.Diffusion;
        break;

    case AL_REVERB_GAIN:
        *val = props->Reverb.Gain;
        break;

    case AL_REVERB_GAINHF:
        *val = props->Reverb.GainHF;
        break;

    case AL_REVERB_DECAY_TIME:
        *val = props->Reverb.DecayTime;
        break;

    case AL_REVERB_DECAY_HFRATIO:
        *val = props->Reverb.DecayHFRatio;
        break;

    case AL_REVERB_REFLECTIONS_GAIN:
        *val = props->Reverb.ReflectionsGain;
        break;

    case AL_REVERB_REFLECTIONS_DELAY:
        *val = props->Reverb.ReflectionsDelay;
        break;

    case AL_REVERB_LATE_REVERB_GAIN:
        *val = props->Reverb.LateReverbGain;
        break;

    case AL_REVERB_LATE_REVERB_DELAY:
        *val = props->Reverb.LateReverbDelay;
        break;

    case AL_REVERB_AIR_ABSORPTION_GAINHF:
        *val = props->Reverb.AirAbsorptionGainHF;
        break;

    case AL_REVERB_ROOM_ROLLOFF_FACTOR:
        *val = props->Reverb.RoomRolloffFactor;
        break;

    default:
        throw effect_exception{AL_INVALID_ENUM, "Invalid reverb float property 0x%04x", param};
    }
}